

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  short sVar2;
  parse_ctx *ppVar3;
  parse_ctx *ppVar4;
  node_t pnVar5;
  node_t pnVar6;
  node_t pnVar7;
  token_t ptVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  node_t_conflict pnVar16;
  size_t mark;
  node_t_conflict pnVar17;
  node_t_conflict pnVar18;
  node_t_conflict pnVar19;
  node_t_conflict op;
  node_t_conflict op_00;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  anon_union_16_10_0af5b411_for_u *list;
  node_code_t nVar23;
  int token_code;
  anon_union_16_10_0af5b411_for_u *paVar24;
  ulong uVar25;
  node *unaff_R12;
  parse_ctx_t parse_ctx;
  node *op_01;
  pos_t pVar26;
  pos_t p;
  pos_t p_00;
  pos_t p_01;
  
  ppVar3 = c2m_ctx->parse_ctx;
  pnVar16 = new_node(c2m_ctx,N_LIST);
  do {
    mark = record_start(c2m_ctx);
    ppVar4 = c2m_ctx->parse_ctx;
    if (*(short *)ppVar4->curr_token == 0x11c) {
      pVar26 = ppVar4->curr_token->pos;
      read_token(c2m_ctx);
      unaff_R12 = right_op(c2m_ctx,1,0x2c,-1,assign_expr,expr);
      if (unaff_R12 != &err_struct) {
        unaff_R12 = new_pos_node1(c2m_ctx,N_CASE,pVar26,unaff_R12);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x10f) {
          read_token(c2m_ctx);
          pnVar17 = right_op(c2m_ctx,1,0x2c,-1,assign_expr,expr);
          if (pnVar17 == &err_struct) {
            unaff_R12 = &err_struct;
            goto LAB_0019b61b;
          }
          op_append(c2m_ctx,unaff_R12,pnVar17);
        }
        goto LAB_0019b5c6;
      }
LAB_0019b61b:
      op_01 = &err_struct;
    }
    else {
      ptVar8 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar8 != 0x120) {
        ptVar8 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar8 == 0x103) {
          pnVar17 = ptVar8->node;
          read_token(c2m_ctx);
          unaff_R12 = new_node(c2m_ctx,N_LABEL);
          op_append(c2m_ctx,unaff_R12,pnVar17);
          goto LAB_0019b5c6;
        }
        if (ppVar4->record_level != 0) goto LAB_0019b61b;
        pcVar22 = "identifier";
LAB_0019b611:
        syntax_error(c2m_ctx,pcVar22);
        goto LAB_0019b61b;
      }
      pVar26 = ptVar8->pos;
      read_token(c2m_ctx);
      unaff_R12 = new_node(c2m_ctx,N_DEFAULT);
      add_pos(c2m_ctx,unaff_R12,pVar26);
LAB_0019b5c6:
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3a) {
        if (ppVar4->record_level != 0) goto LAB_0019b61b;
        pcVar22 = get_token_name(c2m_ctx,0x3a);
        goto LAB_0019b611;
      }
      read_token(c2m_ctx);
      op_01 = unaff_R12;
    }
    record_stop(c2m_ctx,mark,(uint)(op_01 == &err_struct));
    if (op_01 == &err_struct) break;
    op_append(c2m_ctx,pnVar16,op_01);
  } while( true );
  if (*(short *)ppVar3->curr_token == 0x7b) {
    pnVar17 = compound_stmt(c2m_ctx,no_err_p);
    if (pnVar17 == &err_struct) {
      return &err_struct;
    }
    if ((pnVar16->u).s.s == (char *)0x0) {
      return pnVar17;
    }
    pnVar5 = (pnVar17->u).ops.head;
    if ((pnVar5->code == N_LIST) && ((pnVar5->u).s.s == (char *)0x0)) {
      list = &pnVar17->u;
      pnVar6 = (pnVar5->op_link).prev;
      paVar24 = (anon_union_16_10_0af5b411_for_u *)&(pnVar6->op_link).next;
      if (pnVar6 == (node_t)0x0) {
        paVar24 = list;
      }
      (paVar24->s).s = (char *)(pnVar5->op_link).next;
      pnVar7 = (pnVar5->op_link).next;
      if (pnVar7 == (node_t)0x0) {
        if ((node_t)(pnVar17->u).s.len != pnVar5) {
          stmt_cold_1();
          uVar20 = strlen(&list->ch);
          uVar21 = uVar20 + 0x42;
          for (; 0xf < uVar20; uVar20 = uVar20 - 0x10) {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = (list->s).s;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = (list->s).len;
            uVar21 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar14,8) +
                     SUB168(ZEXT816(0x288eea216831e6a7) * auVar14,0) ^
                     SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar13,8) +
                     SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar13,0) ^ uVar21;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar21;
            uVar21 = SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),8) +
                     SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar21;
            list = list + 1;
          }
          if (7 < uVar20) {
            auVar15._8_8_ = 0;
            auVar15._0_8_ = (list->s).s;
            uVar21 = uVar21 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar15,8) +
                              SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar15,0);
            uVar20 = uVar20 - 8;
            list = (anon_union_16_10_0af5b411_for_u *)((long)list + 8);
          }
          if (uVar20 != 0) {
            if (uVar20 == 8) {
              pcVar22 = (list->s).s;
            }
            else {
              if (uVar20 < 4) {
                uVar25 = 0;
                pcVar22 = (char *)0x0;
              }
              else {
                pcVar22 = (char *)((ulong)(uint)list->f << 0x20);
                uVar25 = 4;
              }
              if (uVar25 < uVar20) {
                do {
                  pcVar22 = (char *)((ulong)pcVar22 >> 8 |
                                    (ulong)*(byte *)((long)list + uVar25) << 0x38);
                  uVar25 = uVar25 + 1;
                } while (uVar20 != uVar25);
              }
            }
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pcVar22;
            uVar21 = uVar21 ^ SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),8) +
                              SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),0);
          }
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar21;
          uVar21 = SUB168(auVar11 * ZEXT816(0x65862b62bdf5ef4d),8) +
                   SUB168(auVar11 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar21;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar21;
          return (node_t_conflict)
                 (ulong)((uint)uVar21 ^
                        SUB164(auVar12 * ZEXT816(0x288eea216831e6a7),8) +
                        SUB164(auVar12 * ZEXT816(0x288eea216831e6a7),0));
        }
        (pnVar17->u).ops.tail = pnVar6;
      }
      else {
        (pnVar7->op_link).prev = pnVar6;
      }
      (pnVar5->op_link).prev = (node_t)0x0;
      (pnVar5->op_link).next = (node_t)0x0;
      DLIST_node_t_prepend(&list->ops,pnVar16);
      return pnVar17;
    }
    __assert_fail("NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x143a,"node_t stmt(c2m_ctx_t, int)");
  }
  ptVar8 = c2m_ctx->parse_ctx->curr_token;
  sVar1 = *(short *)ptVar8;
  if (sVar1 == 0x129) {
    unaff_R12 = (node *)(ptVar8->pos).fname;
    mark._0_4_ = (ptVar8->pos).lno;
    mark._4_4_ = (ptVar8->pos).ln_pos;
    read_token(c2m_ctx);
  }
  ptVar8 = c2m_ctx->parse_ctx->curr_token;
  sVar2 = *(short *)ptVar8;
  if (sVar1 == 0x129) {
    if (sVar2 != 0x28) goto LAB_0019bbaa;
    read_token(c2m_ctx);
    pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
    if (pnVar17 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x29) goto LAB_0019bab5;
    read_token(c2m_ctx);
    pnVar18 = stmt(c2m_ctx,no_err_p);
    if (pnVar18 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x123) {
      read_token(c2m_ctx);
      pnVar19 = stmt(c2m_ctx,no_err_p);
      if (pnVar19 == &err_struct) {
        return &err_struct;
      }
    }
    else {
      pnVar19 = new_node(c2m_ctx,N_IGNORE);
    }
    pnVar16 = new_node4(c2m_ctx,N_IF,pnVar16,pnVar17,pnVar18,pnVar19);
LAB_0019bc86:
    p_01.lno = (int)mark;
    p_01.ln_pos = (int)(mark >> 0x20);
    p_01.fname = (char *)unaff_R12;
LAB_0019bc95:
    add_pos(c2m_ctx,pnVar16,p_01);
    return pnVar16;
  }
  if (sVar2 == 0x135) {
    unaff_R12 = (node *)(ptVar8->pos).fname;
    mark._0_4_ = (ptVar8->pos).lno;
    mark._4_4_ = (ptVar8->pos).ln_pos;
    read_token(c2m_ctx);
  }
  ptVar8 = c2m_ctx->parse_ctx->curr_token;
  sVar1 = *(short *)ptVar8;
  if (sVar2 == 0x135) {
    if (sVar1 != 0x28) goto LAB_0019bbaa;
    read_token(c2m_ctx);
    pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
    if (pnVar17 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
      read_token(c2m_ctx);
      pnVar18 = stmt(c2m_ctx,no_err_p);
      if (pnVar18 == &err_struct) {
        return &err_struct;
      }
      nVar23 = N_SWITCH;
LAB_0019b971:
      pVar26.lno = (int)mark;
      pVar26.ln_pos = (int)(mark >> 0x20);
      pVar26.fname = (char *)unaff_R12;
      pnVar16 = new_pos_node3(c2m_ctx,nVar23,pVar26,pnVar16,pnVar17,pnVar18);
      return pnVar16;
    }
LAB_0019bab5:
    if (ppVar3->record_level != 0) {
      return &err_struct;
    }
    token_code = 0x29;
  }
  else {
    if (sVar1 == 0x13c) {
      unaff_R12 = (node *)(ptVar8->pos).fname;
      mark._0_4_ = (ptVar8->pos).lno;
      mark._4_4_ = (ptVar8->pos).ln_pos;
      read_token(c2m_ctx);
    }
    ptVar8 = c2m_ctx->parse_ctx->curr_token;
    sVar2 = *(short *)ptVar8;
    if (sVar1 == 0x13c) {
      if (sVar2 == 0x28) {
        read_token(c2m_ctx);
        pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
        if (pnVar17 == &err_struct) {
          return &err_struct;
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
          read_token(c2m_ctx);
          pnVar18 = stmt(c2m_ctx,no_err_p);
          if (pnVar18 == &err_struct) {
            return &err_struct;
          }
          nVar23 = N_WHILE;
          goto LAB_0019b971;
        }
        goto LAB_0019bab5;
      }
    }
    else if (sVar2 == 0x121) {
      read_token(c2m_ctx);
      pnVar18 = stmt(c2m_ctx,no_err_p);
      if (pnVar18 == &err_struct) {
        return &err_struct;
      }
      ptVar8 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar8 != 0x13c) {
        if (ppVar3->record_level != 0) {
          return &err_struct;
        }
        token_code = 0x13c;
        goto LAB_0019bbbc;
      }
      unaff_R12 = (node *)(ptVar8->pos).fname;
      mark._0_4_ = (ptVar8->pos).lno;
      mark._4_4_ = (ptVar8->pos).ln_pos;
      read_token(c2m_ctx);
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
        read_token(c2m_ctx);
        pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
        if (pnVar17 == &err_struct) {
          return &err_struct;
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
          read_token(c2m_ctx);
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token(c2m_ctx);
            nVar23 = N_DO;
            goto LAB_0019b971;
          }
          goto LAB_0019c16b;
        }
        goto LAB_0019bab5;
      }
    }
    else {
      if (sVar2 == 0x127) {
        unaff_R12 = (node *)(ptVar8->pos).fname;
        mark._0_4_ = (ptVar8->pos).lno;
        mark._4_4_ = (ptVar8->pos).ln_pos;
        read_token(c2m_ctx);
      }
      ptVar8 = c2m_ctx->parse_ctx->curr_token;
      sVar1 = *(short *)ptVar8;
      if (sVar2 != 0x127) {
        if (sVar1 == 0x128) {
          unaff_R12 = (node *)(ptVar8->pos).fname;
          mark._0_4_ = (ptVar8->pos).lno;
          mark._4_4_ = (ptVar8->pos).ln_pos;
          read_token(c2m_ctx);
        }
        ptVar8 = c2m_ctx->parse_ctx->curr_token;
        sVar2 = *(short *)ptVar8;
        if (sVar1 == 0x128) {
          if (sVar2 == 0x2a) {
            read_token(c2m_ctx);
            pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
            if (pnVar17 == &err_struct) {
              return &err_struct;
            }
          }
          else {
            if (sVar2 != 0x103) {
              if (ppVar3->record_level != 0) {
                return &err_struct;
              }
              pcVar22 = "identifier";
              goto LAB_0019bbc7;
            }
            pnVar17 = ptVar8->node;
            read_token(c2m_ctx);
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token(c2m_ctx);
            nVar23 = (sVar2 == 0x2a) + N_GOTO;
LAB_0019c0d0:
            pnVar16 = new_node2(c2m_ctx,nVar23,pnVar16,pnVar17);
            goto LAB_0019bc86;
          }
        }
        else {
          if (sVar2 == 0x11f) {
            unaff_R12 = (node *)(ptVar8->pos).fname;
            mark._0_4_ = (ptVar8->pos).lno;
            mark._4_4_ = (ptVar8->pos).ln_pos;
            read_token(c2m_ctx);
          }
          ptVar8 = c2m_ctx->parse_ctx->curr_token;
          sVar1 = *(short *)ptVar8;
          if (sVar2 == 0x11f) {
            if (sVar1 == 0x3b) {
              read_token(c2m_ctx);
              nVar23 = N_CONTINUE;
LAB_0019bdb2:
              p_00.lno = (int)mark;
              p_00.ln_pos = (int)(mark >> 0x20);
              p_00.fname = (char *)unaff_R12;
              pnVar16 = new_pos_node1(c2m_ctx,nVar23,p_00,pnVar16);
              return pnVar16;
            }
          }
          else {
            if (sVar1 == 0x11b) {
              unaff_R12 = (node *)(ptVar8->pos).fname;
              mark._0_4_ = (ptVar8->pos).lno;
              mark._4_4_ = (ptVar8->pos).ln_pos;
              read_token(c2m_ctx);
            }
            ptVar8 = c2m_ctx->parse_ctx->curr_token;
            if (sVar1 == 0x11b) {
              if (*(short *)ptVar8 == 0x3b) {
                read_token(c2m_ctx);
                nVar23 = N_BREAK;
                goto LAB_0019bdb2;
              }
            }
            else {
              if (*(short *)ptVar8 == 0x12f) {
                unaff_R12 = (node *)(ptVar8->pos).fname;
                mark._0_4_ = (ptVar8->pos).lno;
                mark._4_4_ = (ptVar8->pos).ln_pos;
                read_token(c2m_ctx);
                if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
                  read_token(c2m_ctx);
                  pnVar17 = new_node(c2m_ctx,N_IGNORE);
                }
                else {
                  pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
                  if (pnVar17 == &err_struct) {
                    return &err_struct;
                  }
                  if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) goto LAB_0019c16b;
                  read_token(c2m_ctx);
                }
                nVar23 = N_RETURN;
                goto LAB_0019c0d0;
              }
              if (*(short *)ppVar3->curr_token == 0x3b) {
                pnVar17 = new_node(c2m_ctx,N_IGNORE);
              }
              else {
                pnVar17 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
                if (pnVar17 == &err_struct) {
                  return &err_struct;
                }
              }
              if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
                read_token(c2m_ctx);
                p_01 = get_node_pos(c2m_ctx,pnVar17);
                pnVar16 = new_node2(c2m_ctx,N_EXPR,pnVar16,pnVar17);
                goto LAB_0019bc95;
              }
            }
          }
        }
LAB_0019c16b:
        if (ppVar3->record_level != 0) {
          return &err_struct;
        }
        token_code = 0x3b;
        goto LAB_0019bbbc;
      }
      if (sVar1 == 0x28) {
        read_token(c2m_ctx);
        pnVar17 = new_node(c2m_ctx,N_FOR);
        p.lno = (int)mark;
        p.ln_pos = (int)(mark >> 0x20);
        p.fname = (char *)unaff_R12;
        add_pos(c2m_ctx,pnVar17,p);
        pnVar17->attr = ppVar3->curr_scope;
        ppVar3->curr_scope = pnVar17;
        pnVar18 = try_f(c2m_ctx,declaration);
        ppVar3->curr_scope = (node_t_conflict)pnVar17->attr;
        if (pnVar18 == &err_struct) {
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token(c2m_ctx);
            pnVar18 = new_node(c2m_ctx,N_IGNORE);
          }
          else {
            pnVar18 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
            if (pnVar18 == &err_struct) {
              return &err_struct;
            }
            if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) goto LAB_0019c16b;
            read_token(c2m_ctx);
          }
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
          read_token(c2m_ctx);
          pnVar19 = new_node(c2m_ctx,N_IGNORE);
LAB_0019bf12:
          if (*(short *)ppVar3->curr_token == 0x29) {
            op = new_node(c2m_ctx,N_IGNORE);
          }
          else {
            op = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
            if (op == &err_struct) {
              return &err_struct;
            }
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
            read_token(c2m_ctx);
            op_00 = stmt(c2m_ctx,no_err_p);
            if (op_00 == &err_struct) {
              return &err_struct;
            }
            op_append(c2m_ctx,pnVar17,pnVar16);
            op_append(c2m_ctx,pnVar17,pnVar18);
            op_append(c2m_ctx,pnVar17,pnVar19);
            op_append(c2m_ctx,pnVar17,op);
            op_append(c2m_ctx,pnVar17,op_00);
            return pnVar17;
          }
          if (ppVar3->record_level == 0) {
            pcVar22 = get_token_name(c2m_ctx,0x29);
            syntax_error(c2m_ctx,pcVar22);
          }
          return &err_struct;
        }
        pnVar19 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
        if (pnVar19 != &err_struct) {
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token(c2m_ctx);
            goto LAB_0019bf12;
          }
          if (ppVar3->record_level == 0) {
            pcVar22 = get_token_name(c2m_ctx,0x3b);
            syntax_error(c2m_ctx,pcVar22);
          }
        }
        return &err_struct;
      }
    }
LAB_0019bbaa:
    if (ppVar3->record_level != 0) {
      return &err_struct;
    }
    token_code = 0x28;
  }
LAB_0019bbbc:
  pcVar22 = get_token_name(c2m_ctx,token_code);
LAB_0019bbc7:
  syntax_error(c2m_ctx,pcVar22);
  return &err_struct;
}

Assistant:

D (stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t l, n, op1, op2, op3, r;
  pos_t pos;

  l = new_node (c2m_ctx, N_LIST);
  while ((op1 = TRY (label)) != err_node) {
    op_append (c2m_ctx, l, op1);
  }
  if (C ('{')) {
    P (compound_stmt);
    if (NL_HEAD (l->u.ops) != NULL) { /* replace empty label list */
      assert (NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL);
      NL_REMOVE (r->u.ops, NL_HEAD (r->u.ops));
      NL_PREPEND (r->u.ops, l);
    }
  } else if (MP (T_IF, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    op2 = r;
    if (!M (T_ELSE)) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (stmt);
    }
    r = new_pos_node4 (c2m_ctx, N_IF, pos, l, op1, op2, r);
  } else if (MP (T_SWITCH, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_SWITCH, pos, l, op1, r);
  } else if (MP (T_WHILE, pos)) { /* iteration-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_WHILE, pos, l, op1, r);
  } else if (M (T_DO)) { /* iteration-statement */
    P (stmt);
    op1 = r;
    PTP (T_WHILE, pos);
    PT ('(');
    P (expr);
    PT (')');
    PT (';');
    r = new_pos_node3 (c2m_ctx, N_DO, pos, l, r, op1);
  } else if (MP (T_FOR, pos)) { /* iteration-statement */
    PT ('(');
    n = new_pos_node (c2m_ctx, N_FOR, pos);
    n->attr = curr_scope;
    curr_scope = n;
    if ((r = TRY (declaration)) != err_node) {
      op1 = r;
      curr_scope = n->attr;
    } else {
      curr_scope = n->attr;
      if (!M (';')) {
        P (expr);
        op1 = r;
        PT (';');
      } else {
        op1 = new_node (c2m_ctx, N_IGNORE);
      }
    }
    if (M (';')) {
      op2 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op2 = r;
      PT (';');
    }
    if (C (')')) {
      op3 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op3 = r;
    }
    PT (')');
    P (stmt);
    op_append (c2m_ctx, n, l);
    op_append (c2m_ctx, n, op1);
    op_append (c2m_ctx, n, op2);
    op_append (c2m_ctx, n, op3);
    op_append (c2m_ctx, n, r);
    r = n;
  } else if (MP (T_GOTO, pos)) { /* jump-statement */
    int indirect_p = FALSE;
    if (!M ('*')) {
      PTN (T_ID);
    } else {
      indirect_p = TRUE;
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, indirect_p ? N_INDIRECT_GOTO : N_GOTO, pos, l, r);
  } else if (MP (T_CONTINUE, pos)) { /* continue-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_CONTINUE, pos, l);
  } else if (MP (T_BREAK, pos)) { /* break-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_BREAK, pos, l);
  } else if (MP (T_RETURN, pos)) { /* return-statement */
    if (M (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      PT (';');
    }
    r = new_pos_node2 (c2m_ctx, N_RETURN, pos, l, r);
  } else { /* expression-statement */
    if (C (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, N_EXPR, POS (r), l, r);
  }
  return r;
}